

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
* __thiscall
kratos::GeneratorGraph::topological_sort
          (queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
           *__return_storage_ptr__,GeneratorGraph *this)

{
  bool bVar1;
  _Node_iterator_base<kratos::GeneratorNode_*,_false> local_a0;
  _Node_iterator_base<kratos::GeneratorNode_*,_false> local_98;
  GeneratorNode *local_90;
  GeneratorNode *node;
  pair<kratos::Generator_*const,_kratos::GeneratorNode> *iter;
  iterator __end1;
  iterator __begin1;
  unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
  *__range1;
  undefined1 local_50 [8];
  unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
  visited;
  GeneratorGraph *this_local;
  queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
  *queue;
  
  visited._M_h._M_single_bucket = (__node_base_ptr)this;
  std::
  unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
  ::unordered_set((unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
                   *)local_50);
  std::
  queue<kratos::GeneratorNode*,std::deque<kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>>>
  ::queue<std::deque<kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>>,void>
            ((queue<kratos::GeneratorNode*,std::deque<kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>>>
              *)__return_storage_ptr__);
  __end1 = std::
           unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
           ::begin(&this->nodes_);
  iter = (pair<kratos::Generator_*const,_kratos::GeneratorNode> *)
         std::
         unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
         ::end(&this->nodes_);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false>
                            ,(_Node_iterator_base<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false>
                              *)&iter), bVar1) {
    node = (GeneratorNode *)
           std::__detail::
           _Node_iterator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false,_false>
           ::operator*(&__end1);
    local_90 = &((reference)node)->second;
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
         ::find((unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
                 *)local_50,&local_90);
    local_a0._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
         ::end((unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
                *)local_50);
    bVar1 = std::__detail::operator==(&local_98,&local_a0);
    if (bVar1) {
      topological_sort_helper
                (this,local_90,
                 (unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
                  *)local_50,__return_storage_ptr__);
    }
    std::__detail::
    _Node_iterator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false,_false>::
    operator++(&__end1);
  }
  std::
  unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
  ::~unordered_set((unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
                    *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::queue<GeneratorNode *> GeneratorGraph::topological_sort() {
    std::unordered_set<GeneratorNode *> visited;
    std::queue<GeneratorNode *> queue;
    for (auto &iter : nodes_) {
        auto *node = &iter.second;
        if (visited.find(node) == visited.end()) {
            // visit it
            topological_sort_helper(this, node, visited, queue);
        }
    }
    return queue;
}